

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  basic_string_view<char,_std::char_traits<char>_> other_00;
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  size_type n1_local;
  size_type pos1_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> other_local;
  
  other_local.data_ = (const_pointer)other.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)other.data_;
  local_30 = n1;
  n1_local = pos1;
  pos1_local = (size_type)this;
  local_40 = substr(this,pos1,n1);
  other_00.size_ = (size_type)other_local.data_;
  other_00.data_ = (const_pointer)this_local;
  iVar1 = compare(&local_40,other_00);
  return iVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, basic_string_view other ) const // (2)
    {
        return substr( pos1, n1 ).compare( other );
    }